

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O1

TcParseTableBase * google::protobuf::Message::GetTcParseTableImpl(MessageLite *msg)

{
  Message *this;
  Reflection *pRVar1;
  Metadata MVar2;
  anon_class_8_1_8991fb9c local_10;
  
  this = DownCastMessage<google::protobuf::Message>(msg);
  MVar2 = GetMetadata(this);
  pRVar1 = MVar2.reflection;
  if ((pRVar1->tcparse_table_once_).control_.super___atomic_base<unsigned_int>._M_i != 0xdd) {
    local_10.this = pRVar1;
    absl::lts_20250127::base_internal::
    CallOnceImpl<google::protobuf::Reflection::GetTcParseTable()const::_lambda()_1_>
              (&(pRVar1->tcparse_table_once_).control_,SCHEDULE_COOPERATIVE_AND_KERNEL,&local_10);
  }
  return pRVar1->tcparse_table_;
}

Assistant:

const internal::TcParseTableBase* Message::GetTcParseTableImpl(
    const MessageLite& msg) {
  return DownCastMessage<Message>(msg).GetReflection()->GetTcParseTable();
}